

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

MIR_reg_t get_arg_reg(MIR_type_t arg_type,size_t *int_arg_num,size_t *fp_arg_num,
                     MIR_insn_code_t *mov_code)

{
  MIR_insn_code_t MVar1;
  undefined4 local_2c;
  MIR_reg_t arg_reg;
  MIR_insn_code_t *mov_code_local;
  size_t *fp_arg_num_local;
  size_t *int_arg_num_local;
  MIR_type_t arg_type_local;
  
  if (arg_type == MIR_T_LD) {
    local_2c = 0xffffffff;
    *mov_code = MIR_LDMOV;
  }
  else if ((arg_type == MIR_T_F) || (arg_type == MIR_T_D)) {
    local_2c = get_fp_arg_reg(*fp_arg_num);
    *fp_arg_num = *fp_arg_num + 1;
    MVar1 = MIR_DMOV;
    if (arg_type == MIR_T_F) {
      MVar1 = MIR_FMOV;
    }
    *mov_code = MVar1;
  }
  else {
    local_2c = get_int_arg_reg(*int_arg_num);
    *int_arg_num = *int_arg_num + 1;
    *mov_code = MIR_MOV;
  }
  return local_2c;
}

Assistant:

static MIR_reg_t get_arg_reg (MIR_type_t arg_type, size_t *int_arg_num, size_t *fp_arg_num,
                              MIR_insn_code_t *mov_code) {
  MIR_reg_t arg_reg;

  if (arg_type == MIR_T_LD) {
    arg_reg = MIR_NON_VAR;
    *mov_code = MIR_LDMOV;
  } else if (arg_type == MIR_T_F || arg_type == MIR_T_D) {
    arg_reg = get_fp_arg_reg (*fp_arg_num);
    (*fp_arg_num)++;
#ifdef _WIN32
    (*int_arg_num)++; /* arg slot used by fp, skip int register */
#endif
    *mov_code = arg_type == MIR_T_F ? MIR_FMOV : MIR_DMOV;
  } else { /* including RBLK */
    arg_reg = get_int_arg_reg (*int_arg_num);
#ifdef _WIN32
    (*fp_arg_num)++; /* arg slot used by int, skip fp register */
#endif
    (*int_arg_num)++;
    *mov_code = MIR_MOV;
  }
  return arg_reg;
}